

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

ArrayWithPreallocation<soul::Structure::Member,_8UL> * __thiscall
soul::ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator=
          (ArrayWithPreallocation<soul::Structure::Member,_8UL> *this,
          ArrayWithPreallocation<soul::Structure::Member,_8UL> *other)

{
  size_t i_1;
  long lVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = other->numActive;
  if (this->numActive < uVar2) {
    reserve(this,uVar2);
    lVar1 = 0;
    for (uVar2 = 0; uVar3 = this->numActive, uVar2 < uVar3; uVar2 = uVar2 + 1) {
      Structure::Member::operator=
                ((Member *)(&(this->items->type).category + lVar1),
                 (Member *)(&(other->items->type).category + lVar1));
      lVar1 = lVar1 + 0x40;
    }
    lVar1 = uVar3 << 6;
    for (; uVar3 < other->numActive; uVar3 = uVar3 + 1) {
      Structure::Member::Member
                ((Member *)(&(this->items->type).category + lVar1),
                 (Member *)(&(other->items->type).category + lVar1));
      lVar1 = lVar1 + 0x40;
    }
    this->numActive = other->numActive;
  }
  else {
    shrink(this,uVar2);
    lVar1 = 0;
    for (uVar2 = 0; uVar2 < this->numActive; uVar2 = uVar2 + 1) {
      Structure::Member::operator=
                ((Member *)(&(this->items->type).category + lVar1),
                 (Member *)(&(other->items->type).category + lVar1));
      lVar1 = lVar1 + 0x40;
    }
  }
  return this;
}

Assistant:

ArrayWithPreallocation& operator= (const ArrayWithPreallocation& other)
    {
        if (other.size() > numActive)
        {
            reserve (other.size());

            for (size_t i = 0; i < numActive; ++i)
                items[i] = other.items[i];

            for (size_t i = numActive; i < other.size(); ++i)
                new (items + i) Item (other.items[i]);

            numActive = other.size();
        }
        else
        {
            shrink (other.size());

            for (size_t i = 0; i < numActive; ++i)
                items[i] = other.items[i];
        }

        return *this;
    }